

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

SQInteger __thiscall
SQClass::Next(SQClass *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQTable *pSVar1;
  SQInteger SVar2;
  SQClassMember *obj;
  SQCollectable *local_68;
  SQObjectValue local_60;
  SQClassMember *local_58;
  SQObjectPtr *o;
  SQInteger local_40;
  SQInteger idx;
  SQObjectPtr oval;
  SQObjectPtr *outval_local;
  SQObjectPtr *outkey_local;
  SQObjectPtr *refpos_local;
  SQClass *this_local;
  
  oval.super_SQObject._unVal = (SQObjectValue)outval;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&idx);
  local_40 = SQTable::Next(this->_members,false,refpos,outkey,(SQObjectPtr *)&idx);
  if (local_40 != -1) {
    if ((oval.super_SQObject._0_8_ & 0x1000000) == 0) {
      local_58 = sqvector<SQClassMember>::operator[]
                           (&this->_defaultvalues,(ulong)(oval.super_SQObject._type & 0xffffff));
      if ((local_58->val).super_SQObject._type == OT_WEAKREF) {
        pSVar1 = (local_58->val).super_SQObject._unVal.pTable;
        local_68 = (pSVar1->super_SQDelegable).super_SQCollectable._next;
        local_60 = (SQObjectValue)(pSVar1->super_SQDelegable).super_SQCollectable._prev;
      }
      else {
        local_68 = *(SQCollectable **)&(local_58->val).super_SQObject;
        local_60 = (local_58->val).super_SQObject._unVal;
      }
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)oval.super_SQObject._unVal.pTable,(SQObject *)&local_68);
    }
    else {
      obj = sqvector<SQClassMember>::operator[]
                      (&this->_methods,(ulong)(oval.super_SQObject._type & 0xffffff));
      ::SQObjectPtr::operator=((SQObjectPtr *)oval.super_SQObject._unVal.pTable,&obj->val);
    }
  }
  SVar2 = local_40;
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&idx);
  return SVar2;
}

Assistant:

SQInteger SQClass::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQObjectPtr oval;
    SQInteger idx = _members->Next(false,refpos,outkey,oval);
    if(idx != -1) {
        if(_ismethod(oval)) {
            outval = _methods[_member_idx(oval)].val;
        }
        else {
            SQObjectPtr &o = _defaultvalues[_member_idx(oval)].val;
            outval = _realval(o);
        }
    }
    return idx;
}